

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::detail::write_exponent<char,char*>(int exp,char *it)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  char *unaff_retaddr;
  
  if (exp + 9999U < 19999) {
    uVar2 = (ulong)(uint)-exp;
    if (0 < exp) {
      uVar2 = (ulong)(uint)exp;
    }
    *it = (char)(exp >> 0x1f) * -2 + '+';
    pcVar4 = it + 1;
    uVar1 = (uint)uVar2;
    if (99 < uVar1) {
      uVar3 = (uint)((uVar2 & 0xffff) >> 2) / 0x19;
      uVar2 = (ulong)(uVar3 * 2);
      if (999 < uVar1) {
        it[1] = basic_data<void>::digits[uVar2];
        pcVar4 = it + 2;
      }
      *pcVar4 = basic_data<void>::digits[uVar2 + 1];
      pcVar4 = pcVar4 + 1;
      uVar1 = uVar1 + uVar3 * -100 & 0xffff;
    }
    *(undefined2 *)pcVar4 = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar1 * 2);
    return pcVar4 + 2;
  }
  assert_fail(unaff_retaddr,0,(char *)(ulong)(exp + 9999U));
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}